

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O1

void __thiscall
barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::finished(barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,bool with_cell_counts)

{
  ofstream *poVar1;
  int iVar2;
  pointer puVar3;
  char cVar4;
  long *plVar5;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  undefined7 in_register_00000031;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  
  if ((int)CONCAT71(in_register_00000031,with_cell_counts) != 0) {
    puVar3 = (this->complex->cell_count).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->complex->cell_count).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
    lVar9 = 0;
    iVar8 = 0;
    uVar10 = 0;
    do {
      iVar2 = *(int *)((long)puVar3 + (lVar9 >> 0x1d));
      iVar11 = -iVar2;
      if ((uVar10 & 1) == 0) {
        iVar11 = iVar2;
      }
      iVar8 = iVar8 + iVar11;
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x100000000;
    } while (lVar7 + (ulong)(lVar7 == 0) != uVar10);
    if ((this->min_dimension == 0) && (this->max_dimension == 0xffff)) {
      poVar1 = &(this->
                super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                ).outstream;
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)&(this->
                                        super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                                        ).outstream + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"# Euler characteristic: ",0x18);
      plVar5 = (long *)std::ostream::operator<<(poVar1,iVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
  }
  poVar1 = &(this->
            super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ).outstream;
  cVar4 = (char)poVar1;
  std::ios::widen((char)*(undefined8 *)
                         (*(long *)&(this->
                                    super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                                    ).outstream + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"# Betti numbers:",0x10);
  std::ios::widen((char)*(undefined8 *)
                         (*(long *)&(this->
                                    super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                                    ).outstream + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  if ((this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"#\t\tdim H_",9);
      poVar6 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->min_dimension + (int)uVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      if ((this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (skipped ",10);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      }
      uVar10 = uVar10 + 1;
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)&(this->
                                        super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                                        ).outstream + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
    } while (uVar10 < (ulong)((long)(this->betti).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->betti).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (with_cell_counts) {
    std::ios::widen((char)*(undefined8 *)
                           (*(long *)&(this->
                                      super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                                      ).outstream + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"# Cell counts:",0xe);
    std::ios::widen((char)*(undefined8 *)
                           (*(long *)&(this->
                                      super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                                      ).outstream + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    uVar12 = 1;
    if (1 < this->min_dimension) {
      uVar12 = (uint)this->min_dimension;
    }
    uVar10 = (ulong)(uVar12 - 1);
    if (uVar10 <= ((long)(this->complex->cell_count).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->complex->cell_count).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) - 1U) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"#\t\tdim C_",9);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        uVar10 = uVar10 + 1;
      } while (uVar10 <= ((long)(this->complex->cell_count).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->complex->cell_count).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) - 1U);
    }
  }
  return;
}

Assistant:

void finished(bool with_cell_counts = true) {

		index_t cell_euler_characteristic = 0;
		if (with_cell_counts) {
			for (size_t i = 0; i <= complex->top_dimension(); i++)
				cell_euler_characteristic += (i % 2 == 1 ? -1 : 1) * index_t(complex->number_of_cells(index_t(i)));

			bool computed_full_homology =
			    min_dimension == 0 && max_dimension == std::numeric_limits<unsigned short>::max();
			if (computed_full_homology) {
				file_output_t<Complex>::outstream << std::endl;
				file_output_t<Complex>::outstream << "# Euler characteristic: " << cell_euler_characteristic
				                                  << std::endl;
			}
		}

		file_output_t<Complex>::outstream << std::endl;
		file_output_t<Complex>::outstream << "# Betti numbers:" << std::endl;
		int dim = 0;
		for (size_t idx = 0; idx < betti.size(); idx++) {
			file_output_t<Complex>::outstream << "#\t\tdim H_" << (min_dimension + dim++) << " = " << betti[idx];
			if (skipped[idx] > 0) file_output_t<Complex>::outstream << " (skipped " << skipped[idx] << ")";
			file_output_t<Complex>::outstream << std::endl;
		}

		if (with_cell_counts) {
			file_output_t<Complex>::outstream << std::endl;
			file_output_t<Complex>::outstream << "# Cell counts:" << std::endl;
			for (size_t i = size_t(std::max(0, min_dimension - 1)); i <= complex->top_dimension(); i++)
				file_output_t<Complex>::outstream << "#\t\tdim C_" << i << " = " << complex->number_of_cells(index_t(i))
				                                  << std::endl;
		}
	}